

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

stumpless_target * stumpless_set_destination(stumpless_target *target,char *destination)

{
  network_target *target_00;
  char *mem;
  char *mem_00;
  char *old_destination;
  network_target *net_target;
  char *destination_copy;
  char *destination_local;
  stumpless_target *target_local;
  
  if (target == (stumpless_target *)0x0) {
    raise_argument_empty("target was NULL");
    target_local = (stumpless_target *)0x0;
  }
  else if (destination == (char *)0x0) {
    raise_argument_empty("destination was NULL");
    target_local = (stumpless_target *)0x0;
  }
  else {
    mem_00 = copy_cstring(destination);
    if (mem_00 == (char *)0x0) {
      target_local = (stumpless_target *)0x0;
    }
    else {
      lock_target(target);
      if (target->type == STUMPLESS_NETWORK_TARGET) {
        target_00 = (network_target *)target->id;
        mem = target_00->destination;
        target_00->destination = mem_00;
        clear_error();
        reopen_network_target(target_00);
        unlock_target(target);
        free_mem(mem);
        target_local = target;
      }
      else {
        raise_target_incompatible("destination is only valid for network targets");
        unlock_target(target);
        free_mem(mem_00);
        target_local = (stumpless_target *)0x0;
      }
    }
  }
  return target_local;
}

Assistant:

struct stumpless_target *
stumpless_set_destination( struct stumpless_target *target,
                           const char *destination ) {
  const char *destination_copy;
  struct network_target *net_target;
  const char *old_destination;

  VALIDATE_ARG_NOT_NULL( target );
  VALIDATE_ARG_NOT_NULL( destination );

  destination_copy = copy_cstring( destination );
  if( !destination_copy ) {
    return NULL;
  }

  lock_target( target );
  if( target->type != STUMPLESS_NETWORK_TARGET ) {
    raise_target_incompatible( L10N_DESTINATION_NETWORK_ONLY_ERROR_MESSAGE );
    goto cleanup_and_fail;
  }

  net_target = target->id;
  old_destination = net_target->destination;
  net_target->destination = destination_copy;
  clear_error(  );

  reopen_network_target( net_target );

  unlock_target( target );
  free_mem( old_destination );
  return target;

cleanup_and_fail:
  unlock_target( target );
  free_mem( destination_copy );
  return NULL;
}